

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O2

OutputArea * __thiscall
Outputs::Display::BufferingScanTarget::get_output_area(BufferingScanTarget *this)

{
  PointerSet PVar1;
  PointerSet PVar2;
  size_t sVar3;
  ulong uVar4;
  OutputArea *in_RDI;
  
  PVar1 = (this->submit_pointers_)._M_i;
  PVar2 = (this->read_ahead_pointers_)._M_i;
  (in_RDI->start).line = (ulong)PVar2 >> 0x30;
  (in_RDI->end).line = (ulong)PVar1 >> 0x30;
  (in_RDI->start).scan = (ulong)PVar2 >> 0x20 & 0xffff;
  uVar4 = (ulong)PVar1 >> 0x20 & 0xffff;
  (in_RDI->end).scan = uVar4;
  (in_RDI->start).write_area_x = PVar2.write_area & 0x7ff;
  (in_RDI->start).write_area_y = (uint)PVar2.write_area >> 0xb & 0xffff;
  (in_RDI->end).write_area_x = PVar1.write_area & 0x7ff;
  (in_RDI->end).write_area_y = (uint)((ulong)PVar1 >> 0xb) & 0xffff;
  (this->read_ahead_pointers_)._M_i =
       (PointerSet)((ulong)PVar1 & 0xffff0000ffffffff | uVar4 << 0x20);
  sVar3 = this->output_area_counter_;
  in_RDI->counter = sVar3;
  this->output_area_counter_ = sVar3 + 1;
  return in_RDI;
}

Assistant:

BufferingScanTarget::OutputArea BufferingScanTarget::get_output_area() {
	// The area to draw is that between the read pointers, representing wherever reading
	// last stopped, and the submit pointers, representing all the new data that has been
	// cleared for submission.
	const auto submit_pointers = submit_pointers_.load(std::memory_order::memory_order_acquire);
	const auto read_ahead_pointers = read_ahead_pointers_.load(std::memory_order::memory_order_relaxed);
	std::atomic_thread_fence(std::memory_order::memory_order_acquire);

	OutputArea area;

	area.start.line = read_ahead_pointers.line;
	area.end.line = submit_pointers.line;

	area.start.scan = read_ahead_pointers.scan;
	area.end.scan = submit_pointers.scan;

	area.start.write_area_x = TextureAddressGetX(read_ahead_pointers.write_area);
	area.start.write_area_y = TextureAddressGetY(read_ahead_pointers.write_area);
	area.end.write_area_x = TextureAddressGetX(submit_pointers.write_area);
	area.end.write_area_y = TextureAddressGetY(submit_pointers.write_area);

	// Update the read-ahead pointers.
	read_ahead_pointers_.store(submit_pointers, std::memory_order::memory_order_relaxed);

#ifndef NDEBUG
	area.counter = output_area_counter_;
	++output_area_counter_;
#endif

	return area;
}